

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O0

void __thiscall
sc_core::sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,
          sc_signal_in_if<bool> *interface_)

{
  socklen_t __len;
  sockaddr *__addr;
  sc_port_b<sc_core::sc_signal_in_if<bool>_> *in_RSI;
  sc_port_b<sc_core::sc_signal_in_if<bool>_> *in_RDI;
  sc_port_policy in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int __fd;
  
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::sc_port_b
            (in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  __fd = (int)in_RSI;
  __len = 0x362450;
  (in_RDI->super_sc_port_base).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00362450;
  sc_warn_port_constructor();
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::bind(in_RDI,__fd,__addr,__len);
  return;
}

Assistant:

explicit sc_port( IF& interface_ )
	: base_type( N, P )
	{ sc_warn_port_constructor(); base_type::bind( interface_ ); }